

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::variable_statement::print(variable_statement *this,wostream *os)

{
  size_type sVar1;
  const_reference d;
  ulong local_20;
  size_t i;
  wostream *os_local;
  variable_statement *this_local;
  
  std::operator<<(os,"variable_statement{[");
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::size(&this->l_);
    if (sVar1 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,", ");
    }
    d = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::operator[]
                  (&this->l_,local_20);
    mjs::operator<<(os,d);
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"]}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "variable_statement{[";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << l_[i];
        }
        os << "]}";
    }